

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O3

void av1_upsample_intra_edge_sse4_1(uint8_t *p,int sz)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [32];
  uint uVar18;
  undefined1 (*pauVar19) [16];
  undefined1 in_XMM0 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  p[-2] = p[-1];
  p[sz] = p[(long)sz + -1];
  auVar20 = lddqu(in_XMM0,(undefined1  [16])av1_upsample_intra_edge_sse4_1::kernel[0]);
  auVar21 = lddqu(in_XMM1,(undefined1  [16])av1_upsample_intra_edge_sse4_1::v_const[0]);
  auVar22 = lddqu(in_XMM2,(undefined1  [16])av1_upsample_intra_edge_sse4_1::v_const[1]);
  if (-1 < sz) {
    auVar23 = lddqu(in_XMM3,*(undefined1 (*) [16])(p + 0xe));
    pauVar19 = (undefined1 (*) [16])(p + -2);
    auVar26 = lddqu(in_XMM5,*pauVar19);
    uVar18 = sz + 0x11;
    auVar25 = pmovsxbw(in_XMM4,0x808080808080808);
    do {
      auVar24 = auVar23;
      auVar17._16_16_ = auVar24;
      auVar17._0_16_ = auVar26;
      auVar23 = pshufb(auVar26,auVar21);
      auVar35 = pshufb(auVar26,auVar22);
      auVar23 = pmaddubsw(auVar23,auVar20);
      auVar35 = pmaddubsw(auVar35,auVar20);
      auVar23 = phaddw(auVar23,auVar35);
      auVar35 = pshufb(auVar17._8_16_,auVar21);
      auVar34 = pshufb(auVar17._8_16_,auVar22);
      auVar35 = pmaddubsw(auVar35,auVar20);
      auVar34 = pmaddubsw(auVar34,auVar20);
      auVar35 = phaddw(auVar35,auVar34);
      auVar32._0_2_ = auVar23._0_2_ + auVar25._0_2_;
      auVar32._2_2_ = auVar23._2_2_ + auVar25._2_2_;
      auVar32._4_2_ = auVar23._4_2_ + auVar25._4_2_;
      auVar32._6_2_ = auVar23._6_2_ + auVar25._6_2_;
      auVar32._8_2_ = auVar23._8_2_ + auVar25._8_2_;
      auVar32._10_2_ = auVar23._10_2_ + auVar25._10_2_;
      auVar32._12_2_ = auVar23._12_2_ + auVar25._12_2_;
      auVar32._14_2_ = auVar23._14_2_ + auVar25._14_2_;
      auVar33._0_2_ = auVar35._0_2_ + auVar25._0_2_;
      auVar33._2_2_ = auVar35._2_2_ + auVar25._2_2_;
      auVar33._4_2_ = auVar35._4_2_ + auVar25._4_2_;
      auVar33._6_2_ = auVar35._6_2_ + auVar25._6_2_;
      auVar33._8_2_ = auVar35._8_2_ + auVar25._8_2_;
      auVar33._10_2_ = auVar35._10_2_ + auVar25._10_2_;
      auVar33._12_2_ = auVar35._12_2_ + auVar25._12_2_;
      auVar33._14_2_ = auVar35._14_2_ + auVar25._14_2_;
      auVar32 = psraw(auVar32,4);
      auVar33 = psraw(auVar33,4);
      sVar1 = auVar32._0_2_;
      sVar2 = auVar32._2_2_;
      sVar3 = auVar32._4_2_;
      sVar4 = auVar32._6_2_;
      sVar5 = auVar32._8_2_;
      sVar6 = auVar32._10_2_;
      sVar7 = auVar32._12_2_;
      sVar8 = auVar32._14_2_;
      sVar9 = auVar33._0_2_;
      sVar10 = auVar33._2_2_;
      sVar11 = auVar33._4_2_;
      sVar12 = auVar33._6_2_;
      sVar13 = auVar33._8_2_;
      sVar14 = auVar33._10_2_;
      sVar15 = auVar33._12_2_;
      sVar16 = auVar33._14_2_;
      auVar23._0_14_ = auVar26._1_14_;
      auVar23[0xe] = auVar26[8];
      auVar23[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar32[0xe] - (0xff < sVar8);
      auVar35._14_2_ = auVar23._14_2_;
      auVar35._0_13_ = auVar26._1_13_;
      auVar35[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[0xc] - (0xff < sVar7);
      auVar34._13_3_ = auVar35._13_3_;
      auVar34._0_12_ = auVar26._1_12_;
      auVar34[0xc] = auVar26[7];
      auVar31._12_4_ = auVar34._12_4_;
      auVar31._0_11_ = auVar26._1_11_;
      auVar31[0xb] = (0 < sVar6) * (sVar6 < 0x100) * auVar32[10] - (0xff < sVar6);
      auVar30._11_5_ = auVar31._11_5_;
      auVar30._0_10_ = auVar26._1_10_;
      auVar30[10] = auVar26[6];
      auVar29._10_6_ = auVar30._10_6_;
      auVar29._0_9_ = auVar26._1_9_;
      auVar29[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar32[8] - (0xff < sVar5);
      auVar28._9_7_ = auVar29._9_7_;
      auVar28._0_8_ = auVar26._1_8_;
      auVar28[8] = auVar26[5];
      auVar27._8_8_ = auVar28._8_8_;
      auVar27[7] = (0 < sVar4) * (sVar4 < 0x100) * auVar32[6] - (0xff < sVar4);
      auVar27[6] = auVar26[4];
      auVar27[5] = (0 < sVar3) * (sVar3 < 0x100) * auVar32[4] - (0xff < sVar3);
      auVar27[4] = auVar26[3];
      auVar27[3] = (0 < sVar2) * (sVar2 < 0x100) * auVar32[2] - (0xff < sVar2);
      auVar27[2] = auVar26[2];
      auVar27[0] = auVar26[1];
      auVar27[1] = (0 < sVar1) * (sVar1 < 0x100) * auVar32[0] - (0xff < sVar1);
      *pauVar19 = auVar27;
      pauVar19[1][0] = auVar26[9];
      pauVar19[1][1] = (0 < sVar9) * (sVar9 < 0x100) * auVar33[0] - (0xff < sVar9);
      pauVar19[1][2] = auVar26[10];
      pauVar19[1][3] = (0 < sVar10) * (sVar10 < 0x100) * auVar33[2] - (0xff < sVar10);
      pauVar19[1][4] = auVar26[0xb];
      pauVar19[1][5] = (0 < sVar11) * (sVar11 < 0x100) * auVar33[4] - (0xff < sVar11);
      pauVar19[1][6] = auVar26[0xc];
      pauVar19[1][7] = (0 < sVar12) * (sVar12 < 0x100) * auVar33[6] - (0xff < sVar12);
      pauVar19[1][8] = auVar26[0xd];
      pauVar19[1][9] = (0 < sVar13) * (sVar13 < 0x100) * auVar33[8] - (0xff < sVar13);
      pauVar19[1][10] = auVar26[0xe];
      pauVar19[1][0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar33[10] - (0xff < sVar14);
      pauVar19[1][0xc] = auVar26[0xf];
      pauVar19[1][0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar33[0xc] - (0xff < sVar15);
      pauVar19[1][0xe] = auVar24[0];
      pauVar19[1][0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar33[0xe] - (0xff < sVar16);
      pauVar19 = pauVar19 + 2;
      uVar18 = uVar18 - 0x10;
      auVar23 = ZEXT816(0);
      auVar26 = auVar24;
    } while (0x10 < uVar18);
  }
  return;
}

Assistant:

void av1_upsample_intra_edge_sse4_1(uint8_t *p, int sz) {
  // interpolate half-sample positions
  assert(sz <= 24);

  DECLARE_ALIGNED(16, static const int8_t, kernel[1][16]) = {
    { -1, 9, 9, -1, -1, 9, 9, -1, -1, 9, 9, -1, -1, 9, 9, -1 }
  };

  DECLARE_ALIGNED(
      16, static const int8_t,
      v_const[2][16]) = { { 0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6 },
                          { 4, 5, 6, 7, 5, 6, 7, 8, 6, 7, 8, 9, 7, 8, 9, 10 } };

  // Extend first/last samples (upper-left p[-1], last p[sz-1])
  // to support 4-tap filter
  p[-2] = p[-1];
  p[sz] = p[sz - 1];

  uint8_t *in = &p[-2];
  uint8_t *out = &p[-2];

  int n = sz + 1;  // Input length including upper-left sample

  __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
  __m128i in16 = _mm_lddqu_si128((__m128i *)&in[16]);

  __m128i coef0 = _mm_lddqu_si128((__m128i *)kernel[0]);
  __m128i shuf0 = _mm_lddqu_si128((__m128i *)v_const[0]);
  __m128i shuf1 = _mm_lddqu_si128((__m128i *)v_const[1]);

  while (n > 0) {
    __m128i in8 = _mm_alignr_epi8(in16, in0, 8);
    __m128i d0 = _mm_shuffle_epi8(in0, shuf0);
    __m128i d1 = _mm_shuffle_epi8(in0, shuf1);
    __m128i d2 = _mm_shuffle_epi8(in8, shuf0);
    __m128i d3 = _mm_shuffle_epi8(in8, shuf1);
    d0 = _mm_maddubs_epi16(d0, coef0);
    d1 = _mm_maddubs_epi16(d1, coef0);
    d2 = _mm_maddubs_epi16(d2, coef0);
    d3 = _mm_maddubs_epi16(d3, coef0);
    d0 = _mm_hadd_epi16(d0, d1);
    d2 = _mm_hadd_epi16(d2, d3);
    __m128i eight = _mm_set1_epi16(8);
    d0 = _mm_add_epi16(d0, eight);
    d2 = _mm_add_epi16(d2, eight);
    d0 = _mm_srai_epi16(d0, 4);
    d2 = _mm_srai_epi16(d2, 4);
    d0 = _mm_packus_epi16(d0, d2);
    __m128i in1 = _mm_alignr_epi8(in16, in0, 1);
    __m128i out0 = _mm_unpacklo_epi8(in1, d0);
    __m128i out1 = _mm_unpackhi_epi8(in1, d0);
    _mm_storeu_si128((__m128i *)&out[0], out0);
    _mm_storeu_si128((__m128i *)&out[16], out1);
    in0 = in16;
    in16 = _mm_setzero_si128();
    out += 32;
    n -= 16;
  }
}